

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

void __thiscall
testing::internal::
scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::reset
          (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool bVar1;
  
  if (this->ptr_ != p) {
    bVar1 = IsTrue(true);
    if (bVar1) {
      this_00 = this->ptr_;
      if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::__cxx11::string::~string((string *)this_00);
      }
      operator_delete(this_00);
    }
    this->ptr_ = p;
  }
  return;
}

Assistant:

void reset(T* p = nullptr) {
    if (p != ptr_) {
      if (IsTrue(sizeof(T) > 0)) {  // Makes sure T is a complete type.
        delete ptr_;
      }
      ptr_ = p;
    }
  }